

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O3

void P_DrawRailTrail(AActor *source,TArray<SPortalHit,_SPortalHit> *portalhits,int color1,int color2
                    ,double maxdiff,int flags,PClassActor *spawnclass,DAngle *angle,int duration,
                    double sparsity,double drift,int SpiralOffset,DAngle *pitch)

{
  SPortalHit *pSVar1;
  player_t *ppVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  WORD WVar8;
  byte bVar9;
  FSoundID FVar10;
  uint32 uVar11;
  uint uVar12;
  AWeapon *pAVar13;
  AActor *pAVar14;
  particle_t *ppVar15;
  int iVar16;
  TrailSegment *pTVar17;
  int iVar18;
  TrailSegment *pTVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  PClassActor *type;
  double dVar23;
  double dVar24;
  double dVar25;
  ulong in_XMM0_Qb;
  AWeapon *extraout_XMM0_Qb;
  double dVar26;
  PClassActor *in_XMM1_Qb;
  double dVar27;
  ulong in_XMM2_Qb;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double local_200;
  TArray<TrailSegment,_TrailSegment> local_1f8;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  ulong uStack_1a0;
  PClassActor *local_198;
  undefined8 uStack_190;
  double local_188;
  ulong uStack_180;
  PClassActor *local_178;
  PClassActor *pPStack_170;
  double local_168;
  ulong uStack_160;
  int local_150;
  int local_14c;
  AWeapon *local_148;
  AWeapon *pAStack_140;
  double local_138;
  double dStack_130;
  AWeapon *local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  FSoundID local_100;
  FSoundID local_fc;
  double local_f8 [4];
  TrailSegment local_d8;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  local_138 = (double)CONCAT44(local_138._4_4_,color2);
  local_1e8 = (double)CONCAT44(local_1e8._4_4_,color1);
  local_1f8.Array = (TrailSegment *)0x0;
  local_1f8.Most = 0;
  local_1f8.Count = 0;
  dVar33 = 0.0;
  local_1a8 = drift;
  uStack_1a0 = in_XMM2_Qb;
  local_198 = spawnclass;
  local_188 = maxdiff;
  uStack_180 = in_XMM0_Qb;
  local_178 = (PClassActor *)sparsity;
  pPStack_170 = in_XMM1_Qb;
  local_128 = (AWeapon *)source;
  if (portalhits->Count != 1) {
    uVar20 = 0;
    do {
      pSVar1 = portalhits->Array;
      local_d8.start.Z = pSVar1[uVar20].ContPos.Z;
      local_d8.start.X = pSVar1[uVar20].ContPos.X;
      local_d8.start.Y = pSVar1[uVar20].ContPos.Y;
      local_d8.dir.Z = pSVar1[uVar20].OutDir.Z;
      local_d8.dir.X = pSVar1[uVar20].OutDir.X;
      local_d8.dir.Y = pSVar1[uVar20].OutDir.Y;
      dVar27 = pSVar1[uVar20 + 1].HitPos.X - local_d8.start.X;
      dVar28 = pSVar1[uVar20 + 1].HitPos.Y - local_d8.start.Y;
      dVar23 = pSVar1[uVar20 + 1].HitPos.Z - local_d8.start.Z;
      local_1c8 = dVar33;
      local_1d8 = c_sqrt(dVar23 * dVar23 + dVar28 * dVar28 + dVar27 * dVar27);
      uVar20 = uVar20 + 1;
      iVar16 = 0;
      dVar33 = 1.0;
      iVar18 = 0;
      do {
        lVar22 = 0;
        if (iVar16 != 0) {
          lVar22 = (ulong)(iVar16 != 1) * 8 + 8;
        }
        dVar23 = ABS(*(double *)((long)&local_d8.dir.X + lVar22));
        iVar5 = iVar16;
        if (dVar33 <= dVar23) {
          dVar23 = dVar33;
          iVar5 = iVar18;
        }
        iVar16 = iVar16 + 1;
        dVar33 = dVar23;
        iVar18 = iVar5;
      } while (iVar16 != 3);
      lVar22 = (ulong)(iVar5 != 1) * 8 + 8;
      if (iVar5 == 0) {
        lVar22 = 0;
      }
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      *(undefined8 *)((long)local_f8 + lVar22) = 0x3ff0000000000000;
      dVar33 = local_d8.dir.Y * local_f8[1] + local_d8.dir.X * local_f8[0] +
               local_d8.dir.Z * local_f8[2];
      local_d8.extend.X = (local_f8[0] - dVar33 * local_d8.dir.X) * 3.0;
      local_d8.extend.Y = (local_f8[1] - dVar33 * local_d8.dir.Y) * 3.0;
      local_d8.extend.Z = (local_f8[2] - local_d8.dir.Z * dVar33) * 3.0;
      dVar33 = *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0x48);
      dVar23 = *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0x50);
      dVar28 = (-local_d8.dir.Y * (local_d8.start.Y - dVar23) -
               local_d8.dir.X * (local_d8.start.X - dVar33)) / (local_1d8 * local_1d8);
      dVar27 = 1.0;
      if (dVar28 <= 1.0) {
        dVar27 = dVar28;
      }
      dVar27 = (double)(-(ulong)(0.0 < dVar28) & (ulong)dVar27);
      local_d8.soundpos.X = dVar27 * local_d8.dir.X + local_d8.start.X;
      local_d8.soundpos.Y = dVar27 * local_d8.dir.Y + local_d8.start.Y;
      dVar33 = local_d8.soundpos.X - dVar33;
      dVar23 = local_d8.soundpos.Y - dVar23;
      local_d8.sounddist = dVar23 * dVar23 + dVar33 * dVar33;
      local_d8.length = local_1d8;
      TArray<TrailSegment,_TrailSegment>::Push(&local_1f8,&local_d8);
      dVar33 = local_1c8 + local_1d8;
    } while (uVar20 < portalhits->Count - 1);
  }
  type = local_198;
  local_168 = dVar33 / 3.0 + -0.499999985 + 6755399441055744.0;
  if (SUB84(local_168,0) == 0) goto LAB_003ee312;
  iVar18 = local_1e8._0_4_;
  iVar16 = local_138._0_4_;
  if ((flags & 1U) == 0) {
    ppVar2 = *(player_t **)((long)&(local_128->super_AStateProvider).super_AInventory + 0x230);
    pAVar13 = local_128;
    if ((ppVar2 == (player_t *)0x0) || (pAVar13 = ppVar2->ReadyWeapon, pAVar13 != (AWeapon *)0x0)) {
      FVar10.ID = (((FSoundIDNoInit *)
                   ((long)&(pAVar13->super_AStateProvider).super_AInventory + 0x3c8))->
                  super_FSoundID).ID;
    }
    else {
      FVar10.ID = S_FindSound((char *)0x0);
    }
    if (FVar10.ID == 0) {
      FVar10.ID = S_FindSound("weapons/railgf");
    }
    pAVar14 = (AActor *)(&DAT_017e1fb8)[(long)consoleplayer * 0x54];
    if (pAVar14 == (AActor *)0x0) {
LAB_003ed5d9:
      pAVar14 = (AActor *)0x0;
    }
    else if (((pAVar14->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
      goto LAB_003ed5d9;
    }
    if ((20.0 <= ABS((pAVar14->__Pos).X - ((local_1f8.Array)->start).X)) ||
       (20.0 <= ABS((pAVar14->__Pos).Y - ((local_1f8.Array)->start).Y))) {
      lVar22 = ((ulong)local_1f8._8_8_ >> 0x20) * 0x68;
      pTVar19 = (TrailSegment *)0x0;
      pTVar17 = local_1f8.Array;
      do {
        if ((pTVar19 == (TrailSegment *)0x0) ||
           (pTVar17->sounddist <= pTVar19->sounddist && pTVar19->sounddist != pTVar17->sounddist)) {
          pTVar19 = pTVar17;
        }
        pTVar17 = pTVar17 + 1;
        lVar22 = lVar22 + -0x68;
      } while (lVar22 != 0);
      local_d8.start.X = (pTVar19->soundpos).X;
      local_d8.start.Y = (pTVar19->soundpos).Y;
      local_d8.start.Z = ViewPos.Z;
      local_100.ID = FVar10.ID;
      S_Sound(&local_d8.start,1,&local_100,1.0,1.0);
    }
    else {
      local_fc.ID = FVar10.ID;
      S_Sound(pAVar14,1,&local_fc,1.0,1.0);
    }
  }
  iVar5 = r_rail_spiralsparsity.Value;
  bVar9 = (byte)flags >> 3 & 1;
  if (iVar18 == -1) {
    iVar18 = -1;
LAB_003edb59:
    if (iVar16 != -1) goto LAB_003edb5f;
  }
  else {
    if ((iVar16 == -1) || (r_rail_smartspiral.Value == false)) {
      if (type == (PClassActor *)0x0 && 0 < r_rail_spiralsparsity.Value) {
        local_1c8 = (local_1f8.Array)->length;
        uStack_1c0 = 0;
        if (local_1e8._0_4_ == 0) {
          local_1e8 = (double)CONCAT44(local_1e8._4_4_,0xffffffff);
        }
        else {
          uVar11 = ParticleColor(local_1e8._0_4_);
          local_1e8 = (double)CONCAT44(local_1e8._4_4_,uVar11);
        }
        iVar18 = (int)((double)(iVar5 * local_168._0_4_) / (double)local_178);
        if (iVar18 != 0) {
          local_118 = (double)(iVar5 * 3) * (double)local_178;
          dVar33 = (double)SpiralOffset;
          local_1d8 = ((local_1f8.Array)->start).X;
          dStack_1d0 = ((local_1f8.Array)->start).Y;
          local_1b8 = ((local_1f8.Array)->start).Z;
          local_150 = 0x23;
          if (duration != 0) {
            local_150 = duration;
          }
          uStack_110 = 0;
          local_58 = local_1a8;
          dStack_50 = local_1a8;
          uVar20 = 0;
          local_68 = local_118;
          dStack_60 = local_118;
          do {
            pTVar17 = local_1f8.Array;
            ppVar15 = Particles;
            WVar8 = InactiveParticles;
            if (InactiveParticles == 0xffff) goto LAB_003ee312;
            uVar6 = (ulong)InactiveParticles;
            InactiveParticles = Particles[uVar6].tnext;
            Particles[uVar6].tnext = ActiveParticles;
            ActiveParticles = WVar8;
            ppVar15[uVar6].trans = 0xff;
            ppVar15[uVar6].ttl = (BYTE)duration;
            ppVar15[uVar6].fade = (BYTE)(0xff / (long)local_150);
            ppVar15[uVar6].size = 3.0;
            ppVar15[uVar6].bright = bVar9;
            local_14c = iVar18;
            local_108 = dVar33;
            local_148 = (AWeapon *)
                        FFastTrig::cos(&fasttrig,dVar33 * 11930464.711111112 + 6755399441055744.0);
            pAStack_140 = extraout_XMM0_Qb;
            dVar24 = FFastTrig::sin(&fasttrig,(double)local_148);
            dVar26 = 1.0 - (double)local_148;
            dVar33 = pTVar17[uVar20].dir.Z;
            dVar34 = dVar24 * dVar33;
            dVar27 = pTVar17[uVar20].dir.X;
            dVar28 = pTVar17[uVar20].dir.Y;
            dVar29 = dVar26 * dVar27;
            dVar33 = dVar33 * dVar29;
            dVar32 = dVar28 * dVar26 * dVar28;
            dVar23 = local_1f8.Array[uVar20].extend.Z;
            dVar30 = dVar24 * pTVar17[uVar20].dir.Y;
            dVar31 = dVar26 * dVar28 * pTVar17[uVar20].dir.Z;
            dVar3 = local_1f8.Array[uVar20].extend.X;
            dVar4 = local_1f8.Array[uVar20].extend.Y;
            dVar25 = dVar23 * (dVar30 + dVar33) +
                     ((double)local_148 + dVar27 * dVar29) * dVar3 +
                     dVar4 * (dVar28 * dVar29 - dVar34);
            dVar28 = dVar23 * (dVar31 - dVar27 * dVar24) +
                     ((double)local_148 + dVar32) * dVar4 + dVar3 * (dVar28 * dVar29 + dVar34);
            ppVar15 = ppVar15 + uVar6;
            dVar33 = dVar4 * (dVar31 + dVar27 * dVar24) + (dVar33 - dVar30) * dVar3 +
                     (((dVar26 - dVar27 * dVar29) - dVar32) + (double)local_148) * dVar23;
            (ppVar15->Vel).Z = dVar33 * local_1a8 * 0.0625;
            (ppVar15->Vel).X = dVar25 * local_58 * 0.0625;
            (ppVar15->Vel).Y = dVar28 * dStack_50 * 0.0625;
            (ppVar15->Pos).Z = local_1b8 + dVar33;
            (ppVar15->Pos).X = local_1d8 + dVar25;
            (ppVar15->Pos).Y = dStack_1d0 + dVar28;
            iVar18 = r_rail_spiralsparsity.Value;
            local_48 = local_1f8.Array[uVar20].dir.X;
            dStack_40 = local_1f8.Array[uVar20].dir.Y;
            local_148 = (AWeapon *)(local_1f8.Array[uVar20].dir.Z * local_118);
            if (local_1e8._0_4_ == -1) {
              uVar21 = FRandom::GenRand32(&M_Random);
              uVar21 = uVar21 & 0xff;
              iVar16 = rblue2;
              if (((0x9a < uVar21) && (iVar16 = rblue1, 0xbb < uVar21)) &&
                 (iVar16 = rblue4, uVar21 < 0xde)) {
                iVar16 = rblue3;
              }
              ppVar15->color = iVar16;
            }
            else {
              ppVar15->color = local_1e8._0_4_;
            }
            local_1c8 = local_1c8 - local_118;
            if (local_1c8 <= 0.0) {
              uVar21 = (int)uVar20 + 1;
              uVar20 = (ulong)uVar21;
              if (local_1f8.Count <= uVar21) break;
              local_1d8 = local_1f8.Array[uVar21].start.X -
                          local_1c8 * local_1f8.Array[uVar21].dir.X;
              dStack_1d0 = local_1f8.Array[uVar21].start.Y -
                           local_1c8 * local_1f8.Array[uVar21].dir.Y;
              local_1b8 = local_1f8.Array[uVar21].start.Z -
                          local_1f8.Array[uVar21].dir.Z * local_1c8;
              local_1c8 = local_1c8 + local_1f8.Array[uVar21].length;
            }
            else {
              local_1d8 = local_1d8 + local_48 * local_68;
              dStack_1d0 = dStack_1d0 + dStack_40 * dStack_60;
              local_1b8 = local_1b8 + (double)local_148;
            }
            dVar33 = local_108 + (double)(iVar18 * 0xe);
            iVar18 = local_14c + -1;
          } while (iVar18 != 0);
          type = local_198;
          iVar18 = local_1e8._0_4_;
          iVar16 = local_138._0_4_;
          goto LAB_003edb59;
        }
      }
      iVar18 = local_1e8._0_4_;
      goto LAB_003edb59;
    }
LAB_003edb5f:
    iVar7 = r_rail_trailsparsity.Value;
    iVar5 = r_rail_spiralsparsity.Value;
    if (type == (PClassActor *)0x0 && 0 < r_rail_trailsparsity.Value) {
      local_1e8 = (double)CONCAT44(local_1e8._4_4_,iVar18);
      if (iVar16 == 0) {
        uVar11 = 0xffffffff;
      }
      else {
        uVar11 = ParticleColor(iVar16);
      }
      dVar33 = (double)(iVar7 * local_168._0_4_) / (double)local_178 + -0.499999985 +
               6755399441055744.0;
      if (SUB84(dVar33,0) != 0) {
        local_148 = (AWeapon *)((double)(iVar5 * 3) * (double)local_178);
        local_1c8 = (local_1f8.Array)->length;
        uStack_1c0 = 0;
        local_1d8 = ((local_1f8.Array)->start).X;
        dStack_1d0 = ((local_1f8.Array)->start).Y;
        local_198 = (PClassActor *)((local_1f8.Array)->start).Z;
        iVar18 = 0x21;
        if (duration != 0) {
          iVar18 = duration;
        }
        local_118 = (double)(float)local_1a8;
        local_168 = -local_188;
        uStack_160 = uStack_180 ^ 0x8000000000000000;
        uStack_120 = 0;
        local_1b8 = 0.0;
        dStack_1b0 = 0.0;
        uVar21 = 0;
        local_1a8 = 0.0;
        uStack_1a0 = 0;
        pAStack_140 = local_148;
        local_128 = local_148;
        do {
          ppVar15 = JitterParticle(iVar18,local_118);
          if (ppVar15 == (particle_t *)0x0) break;
          if (local_188 <= 0.0) {
          }
          else {
            uVar12 = FRandom::GenRand32(&M_Random);
            if ((uVar12 & 1) != 0) {
              local_1b8 = (double)(int)(-(uint)((uVar12 & 8) == 0) | 1) + local_1b8;
              local_1b8 = (double)(~-(ulong)(local_168 < local_1b8) & (ulong)local_168 |
                                  (-(ulong)(local_188 <= local_1b8) & (ulong)local_188 |
                                  ~-(ulong)(local_188 <= local_1b8) & (ulong)local_1b8) &
                                  -(ulong)(local_168 < local_1b8));
            }
            if ((uVar12 & 2) != 0) {
              dStack_1b0 = dStack_1b0 + (double)(int)(-(uint)((uVar12 & 0x10) == 0) | 1);
              dStack_1b0 = (double)(~-(ulong)(local_168 < dStack_1b0) & (ulong)local_168 |
                                   (-(ulong)(local_188 <= dStack_1b0) & (ulong)local_188 |
                                   ~-(ulong)(local_188 <= dStack_1b0) & (ulong)dStack_1b0) &
                                   -(ulong)(local_168 < dStack_1b0));
            }
            if ((uVar12 & 4) != 0) {
              local_1a8 = local_1a8 + (double)(int)(-(uint)((uVar12 & 0x20) == 0) | 1);
              local_1a8 = (double)(~-(ulong)(local_168 < local_1a8) & (ulong)local_168 |
                                  (-(ulong)(local_188 <= local_1a8) & (ulong)local_188 |
                                  ~-(ulong)(local_188 <= local_1a8) & (ulong)local_1a8) &
                                  -(ulong)(local_168 < local_1a8));
              uStack_1a0 = ~uStack_1a0 & uStack_160 |
                           (uStack_180 | ~uStack_180 & uStack_1a0) & uStack_1a0;
            }
          }
          ppVar15->size = 2.0;
          (ppVar15->Pos).Z = (double)local_198 + local_1a8;
          (ppVar15->Pos).X = local_1d8 + local_1b8;
          (ppVar15->Pos).Y = dStack_1d0 + dStack_1b0;
          if (local_1e8._0_4_ != -1) {
            (ppVar15->Acc).Z = (ppVar15->Acc).Z + -0.000244140625;
          }
          local_138 = local_1f8.Array[uVar21].dir.X;
          dStack_130 = local_1f8.Array[uVar21].dir.Y;
          local_178 = (PClassActor *)(local_1f8.Array[uVar21].dir.Z * (double)local_128);
          ppVar15->bright = bVar9;
          if (uVar11 == 0xffffffff) {
            uVar12 = FRandom::GenRand32(&M_Random);
            iVar16 = grey4;
            if ((0x54 < (uVar12 & 0xff)) && (iVar16 = grey1, (uVar12 & 0xff) < 0xaa)) {
              iVar16 = grey2;
            }
            ppVar15->color = iVar16;
          }
          else {
            ppVar15->color = uVar11;
          }
          local_1c8 = local_1c8 - (double)local_128;
          if (local_1c8 <= 0.0) {
            uVar21 = uVar21 + 1;
            if (local_1f8.Count <= uVar21) break;
            local_1d8 = local_1f8.Array[uVar21].start.X - local_1c8 * local_1f8.Array[uVar21].dir.X;
            dStack_1d0 = local_1f8.Array[uVar21].start.Y - local_1c8 * local_1f8.Array[uVar21].dir.Y
            ;
            local_198 = (PClassActor *)
                        (local_1f8.Array[uVar21].start.Z - local_1f8.Array[uVar21].dir.Z * local_1c8
                        );
            local_1c8 = local_1c8 + local_1f8.Array[uVar21].length;
          }
          else {
            local_1d8 = local_1d8 + local_138 * (double)local_148;
            dStack_1d0 = dStack_1d0 + dStack_130 * (double)pAStack_140;
            local_198 = (PClassActor *)((double)local_198 + (double)local_178);
          }
          uVar12 = SUB84(dVar33,0) - 1;
          dVar33 = (double)(ulong)uVar12;
        } while (uVar12 != 0);
      }
      goto LAB_003ee312;
    }
  }
  if (type != (PClassActor *)0x0) {
    dVar33 = (double)(~-(ulong)((double)local_178 < 1.0) & (ulong)local_178 |
                     -(ulong)((double)local_178 < 1.0) & 0x4040000000000000);
    iVar18 = (int)((double)(SUB84(local_168,0) * 3) / dVar33);
    if (iVar18 != 0) {
      local_198 = (PClassActor *)(dVar33 * (double)(r_rail_spiralsparsity.Value * 3));
      local_1c8 = (local_1f8.Array)->length;
      uStack_1c0 = 0;
      local_1d8 = ((local_1f8.Array)->start).X;
      dStack_1d0 = ((local_1f8.Array)->start).Y;
      local_200 = ((local_1f8.Array)->start).Z;
      local_1a8 = -local_188;
      uStack_1a0 = uStack_180 ^ 0x8000000000000000;
      uStack_190 = 0;
      local_1e8 = 0.0;
      dStack_1e0 = 0.0;
      uVar21 = 0;
      local_1b8 = 0.0;
      dStack_1b0 = 0.0;
      local_178 = local_198;
      pPStack_170 = local_198;
      do {
        if (0.0 < local_188) {
          uVar12 = FRandom::GenRand32(&pr_railtrail);
          if ((uVar12 & 1) != 0) {
            dVar33 = (double)(int)(-(uint)((uVar12 & 8) == 0) | 1) + local_1e8;
            local_1e8 = (double)(~-(ulong)(local_1a8 < dVar33) & (ulong)local_1a8 |
                                (-(ulong)(local_188 <= dVar33) & (ulong)local_188 |
                                ~-(ulong)(local_188 <= dVar33) & (ulong)dVar33) &
                                -(ulong)(local_1a8 < dVar33));
          }
          if ((uVar12 & 2) != 0) {
            dStack_1e0 = dStack_1e0 + (double)(int)(-(uint)((uVar12 & 0x10) == 0) | 1);
            dStack_1e0 = (double)(~-(ulong)(local_1a8 < dStack_1e0) & (ulong)local_1a8 |
                                 (-(ulong)(local_188 <= dStack_1e0) & (ulong)local_188 |
                                 ~-(ulong)(local_188 <= dStack_1e0) & (ulong)dStack_1e0) &
                                 -(ulong)(local_1a8 < dStack_1e0));
          }
          if ((uVar12 & 4) != 0) {
            local_1b8 = local_1b8 + (double)(int)(-(uint)((uVar12 & 0x20) == 0) | 1);
            local_1b8 = (double)(~-(ulong)(local_1a8 < local_1b8) & (ulong)local_1a8 |
                                (-(ulong)(local_188 <= local_1b8) & (ulong)local_188 |
                                ~-(ulong)(local_188 <= local_1b8) & (ulong)local_1b8) &
                                -(ulong)(local_1a8 < local_1b8));
            dStack_1b0 = (double)(~(ulong)dStack_1b0 & uStack_1a0 |
                                 (uStack_180 | ~uStack_180 & (ulong)dStack_1b0) & (ulong)dStack_1b0)
            ;
          }
        }
        local_d8.start.X = local_1d8 + local_1e8;
        local_d8.start.Y = dStack_1d0 + dStack_1e0;
        local_d8.start.Z = local_200 + local_1b8;
        pAVar14 = AActor::StaticSpawn(type,&local_d8.start,ALLOW_REPLACE,false);
        if (pAVar14 != (AActor *)0x0) {
          if (local_128 != (AWeapon *)0x0) {
            (pAVar14->target).field_0.p = (AActor *)local_128;
          }
          (pAVar14->Angles).Pitch.Degrees = pitch->Degrees;
          (pAVar14->Angles).Yaw.Degrees = angle->Degrees;
        }
        local_1c8 = local_1c8 - (double)local_198;
        if (local_1c8 <= 0.0) {
          uVar21 = uVar21 + 1;
          if (local_1f8.Count <= uVar21) break;
          local_1d8 = local_1f8.Array[uVar21].start.X - local_1c8 * local_1f8.Array[uVar21].dir.X;
          dStack_1d0 = local_1f8.Array[uVar21].start.Y - local_1c8 * local_1f8.Array[uVar21].dir.Y;
          local_200 = local_1f8.Array[uVar21].start.Z - local_1f8.Array[uVar21].dir.Z * local_1c8;
          local_1c8 = local_1c8 + local_1f8.Array[uVar21].length;
        }
        else {
          local_1d8 = local_1d8 + local_1f8.Array[uVar21].dir.X * (double)local_178;
          dStack_1d0 = dStack_1d0 + local_1f8.Array[uVar21].dir.Y * (double)pPStack_170;
          local_200 = local_200 + local_1f8.Array[uVar21].dir.Z * (double)local_198;
        }
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
  }
LAB_003ee312:
  TArray<TrailSegment,_TrailSegment>::~TArray(&local_1f8);
  return;
}

Assistant:

void P_DrawRailTrail(AActor *source, TArray<SPortalHit> &portalhits, int color1, int color2, double maxdiff, int flags, PClassActor *spawnclass, DAngle angle, int duration, double sparsity, double drift, int SpiralOffset, DAngle pitch)
{
	double length = 0;
	int steps, i;
	TArray<TrailSegment> trail;
	TAngle<double> deg;
	DVector3 pos;
	bool fullbright;
	unsigned segment;
	double lencount;

	for (unsigned i = 0; i < portalhits.Size() - 1; i++)
	{
		TrailSegment seg;

		seg.start = portalhits[i].ContPos;
		seg.dir = portalhits[i].OutDir;
		seg.length = (portalhits[i + 1].HitPos - seg.start).Length();

		//Calculate PerpendicularVector (extend, dir):
		double minelem = 1;
		int epos;
		int ii;
		for (epos = 0, ii = 0; ii < 3; ++ii)
		{
			if (fabs(seg.dir[ii]) < minelem)
			{
				epos = ii;
				minelem = fabs(seg.dir[ii]);
			}
		}
		DVector3 tempvec(0, 0, 0);
		tempvec[epos] = 1;
		seg.extend = (tempvec - (seg.dir | tempvec) * seg.dir) * 3;
		length += seg.length;

		// Only consider sound in 2D (for now, anyway)
		// [BB] You have to divide by lengthsquared here, not multiply with it.
		AActor *mo = players[consoleplayer].camera;

		double r = ((seg.start.Y - mo->Y()) * (-seg.dir.Y) - (seg.start.X - mo->X()) * (seg.dir.X)) / (seg.length * seg.length);
		r = clamp<double>(r, 0., 1.);
		seg.soundpos = seg.start + r * seg.dir;
		seg.sounddist = (seg.soundpos - mo->Pos()).LengthSquared();
		trail.Push(seg);
	}

	steps = xs_FloorToInt(length / 3);
	fullbright = !!(flags & RAF_FULLBRIGHT);

	if (steps)
	{
		if (!(flags & RAF_SILENT))
		{
			FSoundID sound;
			
			// Allow other sounds than 'weapons/railgf'!
			if (!source->player) sound = source->AttackSound;
			else if (source->player->ReadyWeapon) sound = source->player->ReadyWeapon->AttackSound;
			else sound = 0;
			if (!sound) sound = "weapons/railgf";

			// The railgun's sound is special. It gets played from the
			// point on the slug's trail that is closest to the hearing player.
			AActor *mo = players[consoleplayer].camera;

			if (fabs(mo->X() - trail[0].start.X) < 20 && fabs(mo->Y() - trail[0].start.Y) < 20)
			{ // This player (probably) fired the railgun
				S_Sound (mo, CHAN_WEAPON, sound, 1, ATTN_NORM);
			}
			else
			{
				TrailSegment *shortest = NULL;
				for (auto &seg : trail)
				{
					if (shortest == NULL || shortest->sounddist > seg.sounddist) shortest = &seg;
				}
				S_Sound (DVector3(shortest->soundpos, ViewPos.Z), CHAN_WEAPON, sound, 1, ATTN_NORM);
			}
		}
	}
	else
	{
		// line is 0 length, so nothing to do
		return;
	}

	// Create the outer spiral.
	if (color1 != -1 && (!r_rail_smartspiral || color2 == -1) && r_rail_spiralsparsity > 0 && (spawnclass == NULL))
	{
		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int spiral_steps = (int)(steps * r_rail_spiralsparsity / sparsity);
		segment = 0;
		lencount = trail[0].length;
		
		color1 = color1 == 0 ? -1 : ParticleColor(color1);
		pos = trail[0].start;
		deg = (double)SpiralOffset;
		for (i = spiral_steps; i; i--)
		{
			particle_t *p = NewParticle ();
			DVector3 tempvec;

			if (!p)
				return;

			int spiralduration = (duration == 0) ? 35 : duration;

			p->trans = 255;
			p->ttl = duration;
			p->fade = FADEFROMTTL(spiralduration);
			p->size = 3;
			p->bright = fullbright;

			tempvec = DMatrix3x3(trail[segment].dir, deg) * trail[segment].extend;
			p->Vel = tempvec * drift / 16.;
			p->Pos = tempvec + pos;
			pos += trail[segment].dir * stepsize;
			deg += double(r_rail_spiralsparsity * 14);
			lencount -= stepsize;
			if (color1 == -1)
			{
				int rand = M_Random();

				if (rand < 155)
					p->color = rblue2;
				else if (rand < 188)
					p->color = rblue1;
				else if (rand < 222)
					p->color = rblue3;
				else
					p->color = rblue4;
			}
			else 
			{
				p->color = color1;
			}

			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}
		}
	}

	// Create the inner trail.
	if (color2 != -1 && r_rail_trailsparsity > 0 && spawnclass == NULL)
	{
		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int trail_steps = xs_FloorToInt(steps * r_rail_trailsparsity / sparsity);

		color2 = color2 == 0 ? -1 : ParticleColor(color2);
		DVector3 diff(0, 0, 0);

		pos = trail[0].start;
		lencount = trail[0].length;
		segment = 0;
		for (i = trail_steps; i; i--)
		{
			// [XA] inner trail uses a different default duration (33).
			int innerduration = (duration == 0) ? 33 : duration;
			particle_t *p = JitterParticle (innerduration, (float)drift);

			if (!p)
				return;

			if (maxdiff > 0)
			{
				int rnd = M_Random ();
				if (rnd & 1)
					diff.X = clamp<double>(diff.X + ((rnd & 8) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 2)
					diff.Y = clamp<double>(diff.Y + ((rnd & 16) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 4)
					diff.Z = clamp<double>(diff.Z + ((rnd & 32) ? 1 : -1), -maxdiff, maxdiff);
			}

			DVector3 postmp = pos + diff;

			p->size = 2;
			p->Pos = postmp;
			if (color1 != -1)
				p->Acc.Z -= 1./4096;
			pos += trail[segment].dir * stepsize;
			lencount -= stepsize;
			p->bright = fullbright;

			if (color2 == -1)
			{
				int rand = M_Random();

				if (rand < 85)
					p->color = grey4;
				else if (rand < 170)
					p->color = grey2;
				else
					p->color = grey1;
			}
			else 
			{
				p->color = color2;
			}
			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}

		}
	}
	// create actors
	if (spawnclass != NULL)
	{
		if (sparsity < 1)
			sparsity = 32;

		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int trail_steps = (int)((steps * 3) / sparsity);
		DVector3 diff(0, 0, 0);

		pos = trail[0].start;
		lencount = trail[0].length;
		segment = 0;

		for (i = trail_steps; i; i--)
		{
			if (maxdiff > 0)
			{
				int rnd = pr_railtrail();
				if (rnd & 1)
					diff.X = clamp<double>(diff.X + ((rnd & 8) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 2)
					diff.Y = clamp<double>(diff.Y + ((rnd & 16) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 4)
					diff.Z = clamp<double>(diff.Z + ((rnd & 32) ? 1 : -1), -maxdiff, maxdiff);
			}			
			AActor *thing = Spawn (spawnclass, pos + diff, ALLOW_REPLACE);
			if (thing)
			{
				if (source)	thing->target = source;
				thing->Angles.Pitch = pitch;
				thing->Angles.Yaw = angle;
			}
			pos += trail[segment].dir * stepsize;
			lencount -= stepsize;
			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}
		}
	}
}